

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReportBuilder.cpp
# Opt level: O2

void __thiscall KDReports::ReportBuilder::addVerticalSpacing(ReportBuilder *this,qreal space)

{
  QTextCursor *pQVar1;
  qreal qVar2;
  QTextBlockFormat blockFormat;
  QTextCharFormat charFormat;
  QTextBlockFormat local_68 [16];
  QTextCharFormat local_58 [16];
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_28;
  
  pQVar1 = cursor(this);
  QTextCursor::beginEditBlock();
  if (this->m_first == false) {
    QTextCursor::insertBlock();
  }
  else {
    this->m_first = false;
  }
  QTextBlockFormat::QTextBlockFormat(local_68);
  qVar2 = mmToPixels(space * 0.5);
  QTextBlockFormat::setTopMargin(local_68,qVar2);
  qVar2 = mmToPixels(space * 0.5);
  QTextBlockFormat::setBottomMargin(local_68,qVar2);
  QTextCursor::setBlockFormat((QTextBlockFormat *)pQVar1);
  QTextCharFormat::QTextCharFormat(local_58);
  QTextCharFormat::setFontPointSize(local_58,1.0);
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar1);
  local_28.d = (Data *)0x0;
  local_28.ptr = L" ";
  local_28.size = 1;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  QTextCursor::insertText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QTextCursor::endEditBlock();
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
  return;
}

Assistant:

void KDReports::ReportBuilder::addVerticalSpacing(qreal space)
{
    QTextCursor &cursor = this->cursor();
    cursor.beginEditBlock();

    if (!m_first) {
        cursor.insertBlock();
    } else {
        m_first = false;
    }

    QTextBlockFormat blockFormat;
    blockFormat.setTopMargin(KDReports::mmToPixels(space / 2));
    blockFormat.setBottomMargin(KDReports::mmToPixels(space / 2));
    cursor.setBlockFormat(blockFormat);
    QTextCharFormat charFormat;
    charFormat.setFontPointSize(1);
    cursor.setCharFormat(charFormat);
    cursor.insertText(QStringLiteral(" ")); // this ensures the point size 1 is actually used, making the paragraph much smaller
    cursor.endEditBlock();
}